

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d8.cpp
# Opt level: O0

void * rw::d3d8::destroyNativeData(void *object,int32 param_2,int32 param_3)

{
  long lVar1;
  uint local_3c;
  long lStack_38;
  uint32 i;
  InstanceData *inst;
  InstanceDataHeader *header;
  Geometry *geometry;
  int32 param_2_local;
  int32 param_1_local;
  void *object_local;
  
  if ((*(long *)((long)object + 0x98) != 0) && (**(int **)((long)object + 0x98) == 8)) {
    lVar1 = *(long *)((long)object + 0x98);
    *(undefined8 *)((long)object + 0x98) = 0;
    lStack_38 = *(long *)(lVar1 + 8);
    for (local_3c = 0; local_3c < *(ushort *)(lVar1 + 6); local_3c = local_3c + 1) {
      d3d::destroyIndexBuffer(*(void **)(lStack_38 + 0x20));
      d3d::destroyVertexBuffer(*(void **)(lStack_38 + 0x28));
      lStack_38 = lStack_38 + 0x38;
    }
    (*DAT_001685f8)(*(undefined8 *)(lVar1 + 8));
    (*DAT_001685f8)(lVar1);
  }
  return object;
}

Assistant:

void*
destroyNativeData(void *object, int32, int32)
{
	Geometry *geometry = (Geometry*)object;
	if(geometry->instData == nil ||
	   geometry->instData->platform != PLATFORM_D3D8)
		return object;
	InstanceDataHeader *header =
		(InstanceDataHeader*)geometry->instData;
	geometry->instData = nil;
	InstanceData *inst = header->inst;
	for(uint32 i = 0; i < header->numMeshes; i++){
		destroyIndexBuffer(inst->indexBuffer);
		destroyVertexBuffer(inst->vertexBuffer);
		inst++;
	}
	rwFree(header->inst);
	rwFree(header);
	return object;
}